

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

char * al_get_new_window_title(void)

{
  thread_local_state *ptVar1;
  char *pcVar2;
  
  ptVar1 = tls_get();
  if ((ptVar1 != (thread_local_state *)0x0) && (ptVar1->new_window_title[0] != '\0')) {
    return ptVar1->new_window_title;
  }
  pcVar2 = al_get_app_name();
  return pcVar2;
}

Assistant:

const char *al_get_new_window_title(void)
{
   thread_local_state *tls;

   /* Return app name in case of error or if not set before. */
   if ((tls = tls_get()) == NULL)
      return al_get_app_name();

   if (strlen(tls->new_window_title) < 1)
      return al_get_app_name();


   return (const char *)tls->new_window_title;
}